

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

string * __thiscall
ritobin::io::write_json_info_abi_cxx11_
          (string *__return_storage_ptr__,io *this,Bin *value,
          vector<char,_std::allocator<char>_> *out,int indent_size)

{
  int indent_size_local;
  vector<char,_std::allocator<char>_> *out_local;
  Bin *value_local;
  
  json_impl::bin_to_json_info((Bin *)this,(vector<char,_std::allocator<char>_> *)value,(int)out);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string write_json_info(Bin const& value, std::vector<char>& out, int indent_size) noexcept {
        bin_to_json_info(value, out, indent_size);
        return {};
    }